

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O3

int archive_read_format_ar_skip(archive_read *a)

{
  long *plVar1;
  int iVar2;
  int64_t iVar3;
  
  plVar1 = (long *)a->format->data;
  iVar3 = __archive_read_consume(a,plVar1[3] + *plVar1 + plVar1[1]);
  if (iVar3 < 0) {
    iVar2 = -0x1e;
  }
  else {
    plVar1[3] = 0;
    *plVar1 = 0;
    plVar1[1] = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
archive_read_format_ar_skip(struct archive_read *a)
{
	int64_t bytes_skipped;
	struct ar* ar;

	ar = (struct ar *)(a->format->data);

	bytes_skipped = __archive_read_consume(a,
	    ar->entry_bytes_remaining + ar->entry_padding
	    + ar->entry_bytes_unconsumed);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	ar->entry_bytes_remaining = 0;
	ar->entry_bytes_unconsumed = 0;
	ar->entry_padding = 0;

	return (ARCHIVE_OK);
}